

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenarioCollection.h
# Opt level: O2

void __thiscall
gurkenlaeufer::ScenarioCollection::appendScenario(ScenarioCollection *this,Scenario *scenario)

{
  _List_iterator<gurkenlaeufer::Step> _Var1;
  ostream *poVar2;
  
  _Var1 = std::
          __find_if<std::_List_iterator<gurkenlaeufer::Step>,__gnu_cxx::__ops::_Iter_pred<gurkenlaeufer::ScenarioCollection::appendScenario(gurkenlaeufer::Scenario)::_lambda(gurkenlaeufer::Step_const&)_1_>>
                    ((scenario->tags).
                     super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>.
                     _M_impl._M_node.super__List_node_base._M_next,&scenario->tags);
  if ((_List_node_base *)&scenario->tags != _Var1._M_node) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ignore scenario ");
    std::operator<<(poVar2,(string *)scenario);
    return;
  }
  std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::
  emplace_back<gurkenlaeufer::Scenario>(&this->_scenarios,scenario);
  return;
}

Assistant:

void appendScenario(Scenario scenario)
    {
        if (scenario.tags.end() != std::find_if(scenario.tags.begin(), scenario.tags.end(), [](const Step& step) {
            if (detail::toLower(step.step) == "@ignore") {
                return true;
            }
            return false; })) {
            std::cout << "Ignore scenario " << scenario.description;
            return;
        }
        _scenarios.emplace_back(std::move(scenario));
    }